

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hunk.cpp
# Opt level: O2

void __thiscall Hunk::flushContext(Hunk *this)

{
  HtmlDivs *this_00;
  bool bVar1;
  int in_ESI;
  QArrayDataPointer<char16_t> QStack_58;
  QArrayDataPointer<QString> local_40;
  QArrayDataPointer<char16_t> local_28;
  
  this_00 = &this->mContext;
  bVar1 = HtmlDivs::isEmpty(this_00);
  if (!bVar1) {
    HtmlDivs::close(this_00,in_ESI);
    HtmlDivs::divs((QStringList *)&local_40,this_00);
    QString::QString((QString *)&QStack_58,"");
    QListSpecialMethods<QString>::join
              ((QString *)&local_28,(QListSpecialMethods<QString> *)&local_40,(QString *)&QStack_58)
    ;
    QList<QString>::emplaceBack<QString>(&this->mLines,(QString *)&local_28);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_28);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_58);
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_40);
    HtmlDivs::clear(this_00);
  }
  return;
}

Assistant:

void Hunk::flushContext() {
    if (mContext.isEmpty()) {
        return;
    }
    mContext.close();
    mLines << mContext.divs().join("");
    mContext.clear();
}